

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O1

void __thiscall
LFPConsumer::LFPConsumer
          (LFPConsumer *this,HighFreqDataType *hf,int ringbufsize,HFParsingInfo *parseargs)

{
  HighFreqDataType local_b0;
  
  HighFreqDataType::HighFreqDataType(&local_b0,hf);
  HFSubConsumer::HFSubConsumer
            (&this->super_HFSubConsumer,&local_b0,(long)ringbufsize,default_consumer_queue_filter);
  HighFreqDataType::~HighFreqDataType(&local_b0);
  (this->super_HFSubConsumer).super_HighFreqSub._vptr_HighFreqSub =
       (_func_int **)&PTR__LFPConsumer_002e7208;
  std::vector<int,_std::allocator<int>_>::vector(&(this->args).indices,&parseargs->indices);
  (this->args).sizeOf = parseargs->sizeOf;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&(this->args).dataRequested,&parseargs->dataRequested);
  (this->args).dataLength = parseargs->dataLength;
  (this->temp).super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->temp).super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->temp).super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_HFSubConsumer).super_HighFreqSub.sockType = ST_FILTERED_CONSUMER;
  return;
}

Assistant:

LFPConsumer::LFPConsumer(HighFreqDataType hf, int ringbufsize, HFParsingInfo parseargs)
    : HFSubConsumer(hf, ringbufsize),
      args(parseargs)
{
    sockType = ST_FILTERED_CONSUMER;
}